

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

void __thiscall
MeCab::EncoderFeatureIndex::shrink
          (EncoderFeatureIndex *this,size_t freq,vector<double,_std::allocator<double>_> *observed)

{
  int iVar1;
  unsigned_long uVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  pointer ppVar6;
  pointer ppVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  reference pvVar9;
  pointer ppVar10;
  vector<double,_std::allocator<double>_> *in_RDX;
  ulong in_RSI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_int>_>::value,_pair<iterator,_bool>_> _Var11;
  const_iterator it_3;
  size_t i_1;
  vector<double,_std::allocator<double>_> observed_new;
  const_iterator it2_1;
  int *f_1;
  int *to;
  const_iterator it_2;
  const_iterator it2;
  iterator it_1;
  size_t i;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> old2new;
  int *f;
  const_iterator it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqv;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
  *in_stack_fffffffffffffdd8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffde0;
  iterator in_stack_fffffffffffffde8;
  allocator_type *in_stack_fffffffffffffdf0;
  size_type in_stack_fffffffffffffdf8;
  undefined1 *__n;
  iterator in_stack_fffffffffffffe00;
  iterator local_1a8;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_1a0;
  undefined4 local_194;
  iterator local_190;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> in_stack_fffffffffffffe78;
  vector<double,_std::allocator<double>_> *pvVar12;
  vector<double,_std::allocator<double>_> *this_00;
  undefined1 local_171;
  vector<double,_std::allocator<double>_> local_170;
  iterator local_158;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_150;
  iterator local_148;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_140;
  int *local_138;
  int *local_130;
  iterator local_128;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
  local_120;
  iterator local_118;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
  local_110;
  _Base_ptr local_108;
  _Base_ptr local_100;
  iterator local_f8;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_f0;
  iterator local_e8;
  _Rb_tree_const_iterator<std::pair<const_int,_int>_> local_e0;
  _Self local_d8;
  _Self local_d0;
  _Base_ptr local_c8;
  undefined1 local_c0;
  unsigned_long local_b8;
  pair<int,_int> local_b0;
  unsigned_long local_a8 [7];
  undefined4 local_6c;
  int *local_68;
  iterator local_60;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
  local_58;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
  local_48 [3];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  vector<double,_std::allocator<double>_> *local_18;
  ulong local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ebeee);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe00._M_node,in_stack_fffffffffffffdf8);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
       ::begin(in_stack_fffffffffffffdd8);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
  ::_Rb_tree_const_iterator(local_48,&local_50);
  while( true ) {
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
         ::end(in_stack_fffffffffffffdd8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
    ::_Rb_tree_const_iterator(&local_58,&local_60);
    bVar3 = std::operator!=(local_48,&local_58);
    if (!bVar3) break;
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
                           *)0x1ebf8d);
    for (local_68 = (ppVar7->second).first; *local_68 != -1; local_68 = local_68 + 1) {
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
                             *)0x1ebfb3);
      uVar2 = (ppVar7->second).second;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_30,(long)*local_68);
      *pvVar5 = uVar2 + *pvVar5;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffde0);
  }
  if (local_10 < 2) {
    local_6c = 1;
  }
  else {
    *(undefined8 *)(in_RDI + 0x160) = 0;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               0x1ec05a);
    for (local_a8[0] = 0; uVar2 = local_a8[0],
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_30),
        uVar2 < sVar4; local_a8[0] = local_a8[0] + 1) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_30,local_a8[0]);
      if (local_10 <= *pvVar5) {
        local_b8 = *(unsigned_long *)(in_RDI + 0x160);
        *(unsigned_long *)(in_RDI + 0x160) = local_b8 + 1;
        std::pair<int,_int>::pair<unsigned_long_&,_unsigned_long,_true>
                  (&local_b0,local_a8,&local_b8);
        _Var11 = std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
                 insert<std::pair<int,int>>
                           ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)in_stack_fffffffffffffdf0,
                            (pair<int,_int> *)in_stack_fffffffffffffde8._M_node);
        local_c8 = (_Base_ptr)_Var11.first._M_node;
        local_c0 = _Var11.second;
      }
    }
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_fffffffffffffdd8);
    while( true ) {
      local_d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)in_stack_fffffffffffffdd8);
      bVar3 = std::operator!=(&local_d0,&local_d8);
      if (!bVar3) break;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                    *)0x1ec1c2);
      local_e8._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      in_stack_fffffffffffffdd8,(key_type_conflict *)0x1ec1d6);
      std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator
                (&local_e0,&local_e8);
      local_f8._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      in_stack_fffffffffffffdd8);
      std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator
                (&local_f0,&local_f8);
      bVar3 = std::operator!=(&local_e0,&local_f0);
      if (bVar3) {
        ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->
                            ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x1ec251);
        iVar1 = ppVar10->second;
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                               *)0x1ec265);
        ppVar6->second = iVar1;
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                      *)in_stack_fffffffffffffde0);
      }
      else {
        local_100 = (_Base_ptr)
                    std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                    ::operator++(in_stack_fffffffffffffde8._M_node,
                                 (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
        local_108 = (_Base_ptr)
                    std::
                    map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    ::erase_abi_cxx11_(in_stack_fffffffffffffde0,in_stack_fffffffffffffde8);
      }
    }
    local_118._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
         ::begin(in_stack_fffffffffffffdd8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
    ::_Rb_tree_const_iterator(&local_110,&local_118);
    while( true ) {
      local_128._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
           ::end(in_stack_fffffffffffffdd8);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
      ::_Rb_tree_const_iterator(&local_120,&local_128);
      bVar3 = std::operator!=(&local_110,&local_120);
      if (!bVar3) break;
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
                             *)0x1ec354);
      local_130 = (ppVar7->second).first;
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
                             *)0x1ec36d);
      for (local_138 = (ppVar7->second).first; *local_138 != -1; local_138 = local_138 + 1) {
        in_stack_fffffffffffffe00 =
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffffdd8,(key_type_conflict *)0x1ec39f);
        local_148._M_node = in_stack_fffffffffffffe00._M_node;
        std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator
                  (&local_140,&local_148);
        local_158._M_node =
             (_Base_ptr)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffffdd8);
        std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator
                  (&local_150,&local_158);
        bVar3 = std::operator!=(&local_140,&local_150);
        if (bVar3) {
          ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->
                              ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x1ec41a);
          *local_130 = ppVar10->second;
          local_130 = local_130 + 1;
        }
      }
      *local_130 = -1;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffde0);
    }
    in_stack_fffffffffffffdf0 = *(allocator_type **)(in_RDI + 0x160);
    __n = &local_171;
    std::allocator<double>::allocator((allocator<double> *)0x1ec499);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00._M_node,
               (size_type)__n,in_stack_fffffffffffffdf0);
    std::allocator<double>::~allocator((allocator<double> *)0x1ec4bf);
    pvVar12 = (vector<double,_std::allocator<double>_> *)0x0;
    while (this_00 = pvVar12,
          pvVar8 = (vector<double,_std::allocator<double>_> *)
                   std::vector<double,_std::allocator<double>_>::size(local_18), pvVar12 < pvVar8) {
      local_194 = SUB84(this_00,0);
      local_190._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      in_stack_fffffffffffffdd8,(key_type_conflict *)0x1ec519);
      std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator
                ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)&stack0xfffffffffffffe78,
                 &local_190);
      local_1a8._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      in_stack_fffffffffffffdd8);
      std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::_Rb_tree_const_iterator
                (&local_1a0,&local_1a8);
      bVar3 = std::operator!=((_Self *)&stack0xfffffffffffffe78,&local_1a0);
      if (bVar3) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (local_18,(size_type)this_00);
        in_stack_fffffffffffffdd8 =
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
              *)*pvVar9;
        ppVar10 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->
                            ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x1ec5b5);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_170,(long)ppVar10->second);
        *pvVar9 = (value_type)in_stack_fffffffffffffdd8;
      }
      pvVar12 = (vector<double,_std::allocator<double>_> *)
                ((long)&(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              (this_00,(vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe78._M_node)
    ;
    local_6c = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdf0);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               0x1ec66e);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdf0);
  return;
}

Assistant:

void EncoderFeatureIndex::shrink(size_t freq,
                                 std::vector<double> *observed) {
  std::vector<size_t> freqv;
  // count fvector
  freqv.resize(maxid_);
  for (std::map<std::string, std::pair<const int*, size_t> >::const_iterator
           it = feature_cache_.begin();
       it != feature_cache_.end(); ++it) {
    for (const int *f = it->second.first; *f != -1; ++f) {
      freqv[*f] += it->second.second;  // freq
    }
  }

  if (freq <= 1) {
    return;
  }

  // make old2new map
  maxid_ = 0;
  std::map<int, int> old2new;
  for (size_t i = 0; i < freqv.size(); ++i) {
    if (freqv[i] >= freq) {
      old2new.insert(std::pair<int, int>(i, maxid_++));
    }
  }

  // update dic_
  for (std::map<std::string, int>::iterator
           it = dic_.begin(); it != dic_.end();) {
    std::map<int, int>::const_iterator it2 = old2new.find(it->second);
    if (it2 != old2new.end()) {
      it->second = it2->second;
      ++it;
    } else {
      dic_.erase(it++);
    }
  }

  // update all fvector
  for (std::map<std::string, std::pair<const int*, size_t> >::const_iterator
           it = feature_cache_.begin(); it != feature_cache_.end(); ++it) {
    int *to = const_cast<int *>(it->second.first);
    for (const int *f = it->second.first; *f != -1; ++f) {
      std::map<int, int>::const_iterator it2 = old2new.find(*f);
      if (it2 != old2new.end()) {
        *to = it2->second;
        ++to;
      }
    }
    *to = -1;
  }

  // update observed vector
  std::vector<double> observed_new(maxid_);
  for (size_t i = 0; i < observed->size(); ++i) {
    std::map<int, int>::const_iterator it = old2new.find(static_cast<int>(i));
    if (it != old2new.end()) {
      observed_new[it->second] = (*observed)[i];
    }
  }

  // copy
  *observed = observed_new;

  return;
}